

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void SobelXYRow_C(uint8 *src_sobelx,uint8 *src_sobely,uint8 *dst_argb,int width)

{
  byte bVar1;
  byte bVar2;
  int32 iVar3;
  int g;
  int b;
  int r;
  int i;
  int width_local;
  uint8 *dst_argb_local;
  uint8 *src_sobely_local;
  uint8 *src_sobelx_local;
  
  _i = dst_argb;
  for (b = 0; b < width; b = b + 1) {
    bVar1 = src_sobelx[b];
    bVar2 = src_sobely[b];
    iVar3 = libyuv::clamp255((uint)bVar1 + (uint)bVar2);
    *_i = bVar2;
    _i[1] = (byte)iVar3;
    _i[2] = bVar1;
    _i[3] = 0xff;
    _i = _i + 4;
  }
  return;
}

Assistant:

void SobelXYRow_C(const uint8* src_sobelx,
                  const uint8* src_sobely,
                  uint8* dst_argb,
                  int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int r = src_sobelx[i];
    int b = src_sobely[i];
    int g = clamp255(r + b);
    dst_argb[0] = (uint8)(b);
    dst_argb[1] = (uint8)(g);
    dst_argb[2] = (uint8)(r);
    dst_argb[3] = (uint8)(255u);
    dst_argb += 4;
  }
}